

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.hpp
# Opt level: O0

void __thiscall OpenMD::GBtailVisitor::~GBtailVisitor(GBtailVisitor *this)

{
  ReplacementVisitor::~ReplacementVisitor(&this->super_ReplacementVisitor);
  return;
}

Assistant:

GBtailVisitor(SimInfo* info) : ReplacementVisitor(info) {
      visitorName = "GBtailVisitor";

      /// these are the atom names we can replace with a fixed structure
      addReplacedAtomName("GBtail");

      // this is the reference structure we'll use for the replacement:
      addSite("C", Vector3d(0.0, 0.0, 9.0));
      addSite("C", Vector3d(0.0, 0.0, 0.0));
      addSite("C", Vector3d(0.0, 0.0, -9.0));
    }